

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O2

any __thiscall cs_impl::any::make_constant<int,__11>(any *this,anon_enum_32 *args)

{
  proxy *ppVar1;
  int local_20 [2];
  holder<int> *local_18;
  
  local_20[1] = 2;
  local_20[0] = 1;
  if ((holder<int>::allocator._520_8_ == 0) || (cs::global_thread_counter != 0)) {
    local_18 = (holder<int> *)operator_new(0x10);
  }
  else {
    local_18 = *(holder<int> **)
                (&holder<cs_impl::path_cs_ext::path_info>::allocator +
                holder<int>::allocator._520_8_ * 8);
    holder<int>::allocator._520_8_ = holder<int>::allocator._520_8_ + -1;
  }
  (local_18->super_baseHolder)._vptr_baseHolder = (_func_int **)&PTR__baseHolder_00246a08;
  local_18->mDat = *args;
  ppVar1 = cs::allocator_type<cs_impl::any::proxy,512ul,cs_impl::default_allocator_provider>::
           alloc<int,int,cs_impl::any::holder<int>*>
                     ((allocator_type<cs_impl::any::proxy,512ul,cs_impl::default_allocator_provider>
                       *)allocator,local_20 + 1,local_20,&local_18);
  this->mDat = ppVar1;
  return (any)(proxy *)this;
}

Assistant:

static any make_constant(ArgsT &&...args)
		{
			return any(allocator.alloc(2, 1, holder<T>::allocator.alloc(std::forward<ArgsT>(args)...)));
		}